

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O2

int my_trace(CURL *handle,curl_infotype type,char *data,size_t size,void *userp)

{
  char cVar1;
  FILE *__stream;
  char cVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  __stream = _stderr;
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"== Info: %s",data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar3 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar3 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar3 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar3 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar3 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar3 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010248f_default;
  }
  cVar1 = *userp;
  curl_mfprintf(_stderr,"%s, %d bytes (0x%x)\n",pcVar3,size & 0xffffffff,size & 0xffffffff);
  lVar6 = 0x40;
  if (cVar1 == '\0') {
    lVar6 = 0x10;
  }
  for (uVar5 = 0; uVar5 < size; uVar5 = uVar5 + lVar6) {
    curl_mfprintf(__stream,"%04x: ",uVar5 & 0xffffffff);
    lVar4 = lVar6;
    uVar7 = uVar5;
    if (cVar1 == '\0') {
      while (lVar4 != 0) {
        if (uVar7 < size) {
          curl_mfprintf(__stream,"%02x ",data[uVar7]);
        }
        else {
          fputs("   ",__stream);
        }
        lVar4 = lVar4 + -1;
        uVar7 = uVar7 + 1;
      }
    }
    lVar4 = 0;
    pcVar3 = data + 2;
LAB_0010259a:
    if ((lVar6 == lVar4) || (size <= lVar4 + uVar5)) goto LAB_00102654;
    if (cVar1 == '\0') {
      cVar2 = pcVar3[uVar5 - 2];
      if (cVar2 < ' ') {
        cVar2 = '.';
      }
      curl_mfprintf(__stream,"%c",cVar2);
      goto LAB_00102639;
    }
    cVar2 = pcVar3[uVar5 - 2];
    if ((size <= lVar4 + uVar5 + 1) || (cVar2 != '\r')) {
      if (cVar2 < ' ') {
        cVar2 = '.';
      }
LAB_0010260b:
      curl_mfprintf(__stream,"%c",cVar2);
      if (((lVar4 + uVar5 + 2 < size) && (pcVar3[uVar5 - 1] == '\r')) && (pcVar3[uVar5] == '\n')) {
        uVar5 = (uVar5 + lVar4) - 0x3d;
        goto LAB_00102654;
      }
LAB_00102639:
      lVar4 = lVar4 + 1;
      pcVar3 = pcVar3 + 1;
      goto LAB_0010259a;
    }
    cVar2 = '.';
    if (pcVar3[uVar5 - 1] != '\n') goto LAB_0010260b;
    uVar5 = (uVar5 + lVar4) - 0x3e;
LAB_00102654:
    fputc(10,__stream);
  }
  fflush(__stream);
switchD_0010248f_default:
  return 0;
}

Assistant:

static
int my_trace(CURL *handle, curl_infotype type,
             char *data, size_t size,
             void *userp)
{
  struct data *config = (struct data *)userp;
  const char *text;
  (void)handle; /* prevent compiler warning */

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "== Info: %s", (char *)data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  dump(text, stderr, (unsigned char *)data, size, config->trace_ascii);
  return 0;
}